

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

TCGv_i64 cpu_reg_aarch64(DisasContext_conflict1 *s,int reg)

{
  TCGv_i64 pTVar1;
  
  if (reg != 0x1f) {
    return s->uc->tcg_ctx->cpu_X[reg];
  }
  pTVar1 = new_tmp_a64_zero_aarch64(s);
  return pTVar1;
}

Assistant:

TCGv_i64 cpu_reg(DisasContext *s, int reg)
{
    if (reg == 31) {
        return new_tmp_a64_zero(s);
    } else {
        return s->uc->tcg_ctx->cpu_X[reg];
    }
}